

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.c++
# Opt level: O0

Maybe<capnp::StructSchema::Field> * __thiscall
capnp::StructSchema::getFieldByDiscriminant
          (Maybe<capnp::StructSchema::Field> *__return_storage_ptr__,StructSchema *this,
          uint16_t discriminant)

{
  uint uVar1;
  uint uVar2;
  Field local_a8;
  undefined1 local_68 [8];
  FieldSubset unionFields;
  uint16_t discriminant_local;
  StructSchema *this_local;
  
  unionFields._70_2_ = discriminant;
  getUnionFields((FieldSubset *)local_68,this);
  uVar1 = (uint)(ushort)unionFields._70_2_;
  uVar2 = FieldSubset::size((FieldSubset *)local_68);
  if (uVar1 < uVar2) {
    FieldSubset::operator[](&local_a8,(FieldSubset *)local_68,(uint)(ushort)unionFields._70_2_);
    kj::Maybe<capnp::StructSchema::Field>::Maybe(__return_storage_ptr__,&local_a8);
  }
  else {
    kj::Maybe<capnp::StructSchema::Field>::Maybe(__return_storage_ptr__,(void *)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<StructSchema::Field> StructSchema::getFieldByDiscriminant(uint16_t discriminant) const {
  auto unionFields = getUnionFields();

  if (discriminant >= unionFields.size()) {
    return nullptr;
  } else {
    return unionFields[discriminant];
  }
}